

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpf_common_sse2.h
# Opt level: O0

void highbd_transpose4x8_8x4_low_sse2
               (__m128i *x0,__m128i *x1,__m128i *x2,__m128i *x3,__m128i *d0,__m128i *d1,__m128i *d2,
               __m128i *d3)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i alVar4;
  __m128i ww1;
  __m128i ww0;
  __m128i w1;
  __m128i w0;
  __m128i zero;
  __m128i *d1_local;
  __m128i *d0_local;
  __m128i *x3_local;
  __m128i *x2_local;
  __m128i *x1_local;
  __m128i *x0_local;
  
  auVar1 = vpunpcklwd_avx((undefined1  [16])*x0,(undefined1  [16])*x1);
  auVar2 = vpunpcklwd_avx((undefined1  [16])*x2,(undefined1  [16])*x3);
  auVar3 = vpunpckldq_avx(auVar1,auVar2);
  auVar1 = vpunpckhdq_avx(auVar1,auVar2);
  alVar4 = (__m128i)vpunpcklqdq_avx(auVar3,ZEXT816(0));
  *d0 = alVar4;
  alVar4 = (__m128i)vpunpckhqdq_avx(auVar3,ZEXT816(0));
  *d1 = alVar4;
  alVar4 = (__m128i)vpunpcklqdq_avx(auVar1,ZEXT816(0));
  *d2 = alVar4;
  alVar4 = (__m128i)vpunpckhqdq_avx(auVar1,ZEXT816(0));
  *d3 = alVar4;
  return;
}

Assistant:

static inline void highbd_transpose4x8_8x4_low_sse2(__m128i *x0, __m128i *x1,
                                                    __m128i *x2, __m128i *x3,
                                                    __m128i *d0, __m128i *d1,
                                                    __m128i *d2, __m128i *d3) {
  __m128i zero = _mm_setzero_si128();
  __m128i w0, w1, ww0, ww1;

  w0 = _mm_unpacklo_epi16(*x0, *x1);  // 00 10 01 11 02 12 03 13
  w1 = _mm_unpacklo_epi16(*x2, *x3);  // 20 30 21 31 22 32 23 33

  ww0 = _mm_unpacklo_epi32(w0, w1);  // 00 10 20 30 01 11 21 31
  ww1 = _mm_unpackhi_epi32(w0, w1);  // 02 12 22 32 03 13 23 33

  *d0 = _mm_unpacklo_epi64(ww0, zero);  // 00 10 20 30 xx xx xx xx
  *d1 = _mm_unpackhi_epi64(ww0, zero);  // 01 11 21 31 xx xx xx xx
  *d2 = _mm_unpacklo_epi64(ww1, zero);  // 02 12 22 32 xx xx xx xx
  *d3 = _mm_unpackhi_epi64(ww1, zero);  // 03 13 23 33 xx xx xx xx
}